

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount initialBlockSize,bool allocateBlock,
          JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  StaticType *type;
  undefined4 *puVar3;
  Recycler *recycler;
  Block *block_00;
  Block *block;
  JavascriptLibrary *library_local;
  bool allocateBlock_local;
  CharCount initialBlockSize_local;
  CompoundString *this_local;
  
  type = JavascriptLibrary::GetStringTypeStatic(library);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfc9b0;
  BlockInfo::BlockInfo(&this->lastBlockInfo);
  this->directCharLength = 0xffffffff;
  this->ownsLastBlock = true;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierPtr(&this->lastBlock);
  if (!allocateBlock) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1d9,"(allocateBlock)","allocateBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1da,"(library)","library");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  recycler = JavascriptLibrary::GetRecycler(library);
  block_00 = Block::New(initialBlockSize,(Block *)0x0,recycler);
  BlockInfo::CopyFrom(&this->lastBlockInfo,block_00);
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,block_00);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount initialBlockSize,
        const bool allocateBlock,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(static_cast<CharCount>(-1)),
        ownsLastBlock(true)
    {
        Assert(allocateBlock);
        Assert(library);

        Block *const block = Block::New(initialBlockSize, nullptr, library->GetRecycler());
        lastBlockInfo.CopyFrom(block);
        lastBlock = block;
    }